

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManComputeDoms(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->vDoms == (Vec_Int_t *)0x0) {
    pVVar2 = Vec_IntAlloc(0);
    p->vDoms = pVVar2;
  }
  pVVar2 = p->vDoms;
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(pVVar2,iVar1,-1);
  local_1c = p->nObjs;
  while( true ) {
    local_1c = local_1c + -1;
    bVar4 = false;
    if (-1 < local_1c) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if ((((local_1c != 0) && (iVar1 = Gia_ObjIsCi(pGStack_18), iVar1 == 0)) &&
        ((*(ulong *)pGStack_18 >> 0x3e & 1) == 0)) &&
       (((p->pRefs == (int *)0x0 || (iVar1 = Gia_ObjIsAnd(pGStack_18), iVar1 == 0)) ||
        (iVar1 = Gia_ObjRefNum(p,pGStack_18), iVar1 != 0)))) {
      iVar1 = Gia_ObjIsCo(pGStack_18);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pGStack_18);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                        ,0x69,"void Gia_ManComputeDoms(Gia_Man_t *)");
        }
        pGVar3 = Gia_ObjFanin0(pGStack_18);
        Gia_ManAddDom(p,pGVar3,local_1c);
        pGVar3 = Gia_ObjFanin1(pGStack_18);
        Gia_ManAddDom(p,pGVar3,local_1c);
      }
      else {
        Gia_ObjSetDom(p,pGStack_18,local_1c);
        pGVar3 = Gia_ObjFanin0(pGStack_18);
        Gia_ManAddDom(p,pGVar3,local_1c);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManComputeDoms( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vDoms == NULL )
        p->vDoms = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vDoms, Gia_ManObjNum(p), -1 );
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( i == 0 || Gia_ObjIsCi(pObj) )
            continue;
        if ( pObj->fMark1 || (p->pRefs && Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p, pObj) == 0) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            Gia_ObjSetDom( p, pObj, i );
            Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
        Gia_ManAddDom( p, Gia_ObjFanin1(pObj), i );
    }
}